

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.c
# Opt level: O1

void blake2b_reset(ssh_hash *hash)

{
  hash[-0x10].binarysink_ = (BinarySink *)0x6a09e667f3bcc908;
  hash[-0xf].vt = (ssh_hashalg *)0xbb67ae8584caa73b;
  hash[-0xd].binarysink_ = (BinarySink *)0x1f83d9abfb41bd6b;
  hash[-0xc].vt = (ssh_hashalg *)0x5be0cd19137e2179;
  hash[-0xe].binarysink_ = (BinarySink *)0x510e527fade682d1;
  hash[-0xd].vt = (ssh_hashalg *)0x9b05688c2b3e6c1f;
  hash[-0xf].binarysink_ = (BinarySink *)0x3c6ef372fe94f82b;
  hash[-0xe].vt = (ssh_hashalg *)0xa54ff53a5f1d36f1;
  hash[-0x10].binarysink_ =
       (BinarySink *)
       ((ulong)*(uint *)&hash[-0xc].binarysink_ ^ (ulong)hash[-0x10].binarysink_ ^ 0x1010000);
  hash[-3].vt = (ssh_hashalg *)0x0;
  hash[-3].binarysink_ = (BinarySink *)0x0;
  hash[-2].vt = (ssh_hashalg *)0x0;
  return;
}

Assistant:

static void blake2b_reset(ssh_hash *hash)
{
    blake2b *s = container_of(hash, blake2b, hash);

    /* Initialise the hash to the standard IV */
    memcpy(s->h, iv, sizeof(s->h));

    /* XOR in the parameters: secret key length (here always 0) in
     * byte 1, and hash length in byte 0. */
    s->h[0] ^= 0x01010000 ^ s->hashlen;

    s->used = 0;
    s->lenhi = s->lenlo = 0;
}